

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createAsm(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  raw_ostream *this_00;
  PSNode *node;
  PSNodesSeq *pPVar1;
  
  if (createAsm(llvm::Instruction_const*)::warned == '\0') {
    this_00 = (raw_ostream *)llvm::errs();
    llvm::raw_ostream::operator<<(this_00,"PTA: Inline assembly found, analysis  may be unsound\n");
    createAsm(llvm::Instruction_const*)::warned = '\x01';
  }
  node = PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNode*&,unsigned_long_const&>
                   ((PointerGraph *)this,(PSNode **)&UNKNOWN_MEMORY,&Offset::UNKNOWN);
  node->pairedNode = node;
  pPVar1 = addNode(this,(Value *)Inst,node);
  return pPVar1;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createAsm(const llvm::Instruction *Inst) {
    // we filter irrelevant calls in isRelevantCall()
    // and we don't have assembler there at all. If
    // we are here, then we got here because this
    // is undefined call that returns pointer.
    // In this case return an unknown pointer
    static bool warned = false;
    if (!warned) {
        llvm::errs()
                << "PTA: Inline assembly found, analysis  may be unsound\n";
        warned = true;
    }

    PSNode *n =
            PS.create<PSNodeType::CONSTANT>(UNKNOWN_MEMORY, Offset::UNKNOWN);
    // it is call that returns pointer, so we'd like to have
    // a 'return' node that contains that pointer
    n->setPairedNode(n);
    return addNode(Inst, n);
}